

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar107;
  ulong uVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  ulong uVar112;
  ulong uVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe r;
  secp256k1_fe local_88;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  long local_38;
  
  uVar109 = (a->z).n[0];
  uVar114 = (a->z).n[1];
  uVar117 = (a->z).n[2];
  uVar110 = (a->z).n[3];
  uVar111 = (a->z).n[4];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar109 * 2;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar110;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar114 * 2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar117;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar111;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar111;
  uVar108 = SUB168(auVar3 * auVar53,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar108 & 0xfffffffffffff;
  auVar1 = auVar2 * auVar52 + auVar1 * auVar51 + auVar4 * ZEXT816(0x1000003d10);
  uVar112 = auVar1._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar112 >> 0x34 | auVar1._8_8_ << 0xc;
  uVar111 = uVar111 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar109;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar111;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar114 * 2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar110;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar117;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar117;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar108 >> 0x34 | SUB168(auVar3 * auVar53,8) << 0xc;
  auVar1 = auVar5 * auVar54 + auVar93 + auVar6 * auVar55 + auVar7 * auVar56 +
           auVar8 * ZEXT816(0x1000003d10);
  uVar113 = auVar1._0_8_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar113 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar109;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar109;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar114;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar111;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar117 * 2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar110;
  auVar1 = auVar10 * auVar58 + auVar94 + auVar11 * auVar59;
  uVar108 = auVar1._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar108 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = (uVar108 & 0xfffffffffffff) << 4 | (uVar113 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar9 * auVar57 + ZEXT816(0x1000003d1) * auVar60;
  uVar115 = auVar1._0_8_;
  uVar108 = uVar115 & 0xfffffffffffff;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar115 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar109 * 2;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar114;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar117;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar111;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar110;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar110;
  auVar2 = auVar13 * auVar62 + auVar96 + auVar14 * auVar63;
  uVar115 = auVar2._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar115 & 0xfffffffffffff;
  auVar1 = auVar12 * auVar61 + auVar95 + auVar15 * ZEXT816(0x1000003d10);
  uVar116 = auVar1._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar115 >> 0x34 | auVar2._8_8_ << 0xc;
  uVar115 = uVar116 & 0xfffffffffffff;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar116 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar109 * 2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar117;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar114;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar114;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar110;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar111;
  auVar98 = auVar18 * auVar66 + auVar98;
  uVar114 = auVar98._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar114 & 0xfffffffffffff;
  auVar1 = auVar16 * auVar64 + auVar97 + auVar17 * auVar65 + auVar19 * ZEXT816(0x1000003d10);
  uVar117 = auVar1._0_8_;
  uVar109 = uVar117 & 0xfffffffffffff;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = (uVar117 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar112 & 0xfffffffffffff);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar114 >> 0x34 | auVar98._8_8_ << 0xc;
  auVar99 = auVar20 * ZEXT816(0x1000003d10) + auVar99;
  uVar117 = auVar99._0_8_;
  uVar114 = uVar117 & 0xfffffffffffff;
  uVar112 = (uVar117 >> 0x34 | auVar99._8_8_ << 0xc) + (uVar113 & 0xffffffffffff);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = x->n[0];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar114;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = x->n[1];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar109;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = x->n[2];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar115;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = x->n[3];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar108;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = x->n[4];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar112;
  uVar117 = SUB168(auVar25 * auVar71,0);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar117 & 0xfffffffffffff;
  auVar1 = auVar22 * auVar68 + auVar21 * auVar67 + auVar23 * auVar69 + auVar24 * auVar70 +
           auVar26 * ZEXT816(0x1000003d10);
  uVar110 = auVar1._0_8_;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar110 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = x->n[0];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar112;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = x->n[1];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar114;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = x->n[2];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar109;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = x->n[3];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar115;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = x->n[4];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar108;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar117 >> 0x34 | SUB168(auVar25 * auVar71,8) << 0xc;
  auVar1 = auVar27 * auVar72 + auVar100 + auVar28 * auVar73 + auVar29 * auVar74 + auVar30 * auVar75
           + auVar31 * auVar76 + auVar32 * ZEXT816(0x1000003d10);
  uVar117 = auVar1._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar117 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = x->n[0];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar108;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = x->n[1];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar112;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = x->n[2];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar114;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = x->n[3];
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar109;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = x->n[4];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar115;
  auVar1 = auVar34 * auVar78 + auVar101 + auVar35 * auVar79 + auVar36 * auVar80 + auVar37 * auVar81;
  uVar111 = auVar1._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar111 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = (uVar111 & 0xfffffffffffff) << 4 | (uVar117 & 0xfffffffffffff) >> 0x30;
  auVar1 = auVar33 * auVar77 + ZEXT816(0x1000003d1) * auVar82;
  uVar111 = auVar1._0_8_;
  local_58 = uVar111 & 0xfffffffffffff;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar111 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = x->n[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar115;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = x->n[1];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar108;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = x->n[2];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar112;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = x->n[3];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar114;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = x->n[4];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar109;
  auVar2 = auVar40 * auVar85 + auVar103 + auVar41 * auVar86 + auVar42 * auVar87;
  uVar111 = auVar2._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar111 & 0xfffffffffffff;
  auVar1 = auVar38 * auVar83 + auVar102 + auVar39 * auVar84 + auVar43 * ZEXT816(0x1000003d10);
  uVar113 = auVar1._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar111 >> 0x34 | auVar2._8_8_ << 0xc;
  uStack_50 = uVar113 & 0xfffffffffffff;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar113 >> 0x34 | auVar1._8_8_ << 0xc;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = x->n[0];
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar109;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = x->n[1];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar115;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = x->n[2];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar108;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = x->n[3];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar112;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = x->n[4];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar114;
  auVar2 = auVar47 * auVar91 + auVar105 + auVar48 * auVar92;
  uVar109 = auVar2._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar109 & 0xfffffffffffff;
  auVar1 = auVar44 * auVar88 + auVar104 + auVar45 * auVar89 + auVar46 * auVar90 +
           auVar49 * ZEXT816(0x1000003d10);
  uVar114 = auVar1._0_8_;
  local_48 = uVar114 & 0xfffffffffffff;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = (uVar114 >> 0x34 | auVar1._8_8_ << 0xc) + (uVar110 & 0xfffffffffffff);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar109 >> 0x34 | auVar2._8_8_ << 0xc;
  auVar106 = auVar50 * ZEXT816(0x1000003d10) + auVar106;
  uVar109 = auVar106._0_8_;
  uStack_40 = uVar109 & 0xfffffffffffff;
  local_38 = (uVar109 >> 0x34 | auVar106._8_8_ << 0xc) + (uVar117 & 0xffffffffffff);
  uVar109 = (a->x).n[4];
  uVar117 = (uVar109 >> 0x30) * 0x1000003d1 + (a->x).n[0];
  uVar110 = (uVar117 >> 0x34) + (a->x).n[1];
  uVar111 = (uVar110 >> 0x34) + (a->x).n[2];
  uVar114 = (uVar111 >> 0x34) + (a->x).n[3];
  local_88.n[0] = ((uVar117 & 0xfffffffffffff) - local_58) + 0x3ffffbfffff0bc;
  local_88.n[1] = ((uVar110 & 0xfffffffffffff) - uStack_50) + 0x3ffffffffffffc;
  local_88.n[2] = ((uVar111 & 0xfffffffffffff) - local_48) + 0x3ffffffffffffc;
  local_88.n[3] = ((uVar114 & 0xfffffffffffff) - uStack_40) + 0x3ffffffffffffc;
  local_88.n[4] = ((uVar109 & 0xffffffffffff) - local_38) + 0x3fffffffffffc + (uVar114 >> 0x34);
  iVar107 = secp256k1_fe_normalizes_to_zero_var(&local_88);
  return iVar107;
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r, r2;
    VERIFY_CHECK(!a->infinity);
    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    r2 = a->x; secp256k1_fe_normalize_weak(&r2);
    return secp256k1_fe_equal_var(&r, &r2);
}